

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  ImVec2 *p;
  double *pdVar1;
  double dVar2;
  short sVar3;
  undefined4 uVar4;
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  ImVec2 IVar7;
  ImVec2 IVar8;
  ImGuiContext *pIVar9;
  ImGuiWindow **ppIVar10;
  ImGuiWindow *pIVar11;
  undefined1 uVar12;
  uint uVar13;
  byte bVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  byte bVar18;
  ulong uVar19;
  bool bVar20;
  byte bVar21;
  byte bVar22;
  ImGuiWindow *pIVar23;
  ImGuiContext *g;
  bool bVar24;
  float fVar25;
  float fVar28;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  ImGuiWindow *local_98;
  ImRect local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  ImRect local_40;
  
  pIVar9 = GImGui;
  local_58._8_8_ = 0;
  local_58._0_4_ = (GImGui->Style).TouchExtraPadding.x;
  local_58._4_4_ = (GImGui->Style).TouchExtraPadding.y;
  local_68 = maxps(local_58,_DAT_0027a2a0);
  GImGui->WindowsHoverPadding = local_68._0_8_;
  pIVar11 = pIVar9->MovingWindow;
  pIVar23 = (ImGuiWindow *)0x0;
  if ((pIVar11 != (ImGuiWindow *)0x0) && ((pIVar11->Flags & 0x200) == 0)) {
    pIVar23 = pIVar11;
  }
  p = &(pIVar9->IO).MousePos;
  uVar4._0_1_ = (pIVar9->IO).ConfigWindowsResizeFromEdges;
  uVar4._1_1_ = (pIVar9->IO).ConfigWindowsMoveFromTitleBarOnly;
  uVar4._2_2_ = *(undefined2 *)&(pIVar9->IO).field_0xc6;
  local_98 = (ImGuiWindow *)0x0;
  local_78._4_4_ = uVar4;
  local_78._0_4_ = uVar4;
  local_78._8_4_ = uVar4;
  local_78._12_4_ = 0;
  iVar16 = (pIVar9->Windows).Size;
LAB_0013b02e:
  do {
    iVar15 = iVar16;
    if (iVar15 < 1) {
LAB_0013b190:
      pIVar9->HoveredWindow = pIVar23;
      pIVar9->HoveredWindowUnderMovingWindow = local_98;
      pIVar11 = GetTopMostPopupModal();
      bVar24 = false;
      if ((pIVar11 != (ImGuiWindow *)0x0) && (bVar24 = false, pIVar23 != (ImGuiWindow *)0x0)) {
        bVar24 = IsWindowChildOf(pIVar23->RootWindow,pIVar11);
        bVar24 = !bVar24;
      }
      uVar13 = (pIVar9->IO).ConfigFlags;
      uVar17 = 0xffffffffffffffff;
      uVar19 = 0;
      bVar14 = 0;
      while( true ) {
        iVar16 = (int)uVar17;
        if (uVar19 == 5) break;
        if ((pIVar9->IO).MouseClicked[uVar19] == true) {
          bVar20 = true;
          if (pIVar23 == (ImGuiWindow *)0x0) {
            bVar20 = 0 < (pIVar9->OpenPopupStack).Size;
          }
          (pIVar9->IO).MouseDownOwned[uVar19] = bVar20;
        }
        bVar20 = (pIVar9->IO).MouseDown[uVar19];
        if ((bVar20 == true) &&
           ((iVar16 == -1 ||
            (dVar2 = (pIVar9->IO).MouseClickedTime[iVar16],
            pdVar1 = (pIVar9->IO).MouseClickedTime + uVar19, *pdVar1 <= dVar2 && dVar2 != *pdVar1)))
           ) {
          uVar17 = uVar19 & 0xffffffff;
        }
        bVar14 = bVar14 & 1 | bVar20;
        uVar19 = uVar19 + 1;
      }
      bVar22 = 1;
      bVar18 = 1;
      if (iVar16 != -1) {
        bVar18 = (pIVar9->IO).MouseDownOwned[iVar16];
      }
      bVar21 = (byte)((uVar13 & 0x10) >> 4) | bVar24;
      if (pIVar9->DragDropActive == true) {
        bVar22 = (pIVar9->DragDropSourceFlags & 0x10U) == 0 | bVar21;
      }
      if (bVar18 != 0) {
        bVar22 = bVar21;
      }
      if (bVar22 != 0) {
        pIVar9->HoveredWindow = (ImGuiWindow *)0x0;
        pIVar9->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
        pIVar23 = (ImGuiWindow *)0x0;
      }
      if (pIVar9->WantCaptureMouseNextFrame == -1) {
        bVar24 = true;
        if ((bVar18 & (pIVar23 != (ImGuiWindow *)0x0 | bVar14)) == 0) {
          bVar24 = 0 < (pIVar9->OpenPopupStack).Size;
        }
        (pIVar9->IO).WantCaptureMouse = bVar24;
      }
      else {
        (pIVar9->IO).WantCaptureMouse = pIVar9->WantCaptureMouseNextFrame != 0;
      }
      if (pIVar9->WantCaptureKeyboardNextFrame == -1) {
        bVar24 = pIVar9->ActiveId != 0 || pIVar11 != (ImGuiWindow *)0x0;
      }
      else {
        bVar24 = pIVar9->WantCaptureKeyboardNextFrame != 0;
      }
      uVar13 = uVar13 & 9;
      uVar12 = (char)uVar13;
      if (uVar13 != 1) {
        uVar12 = bVar24;
      }
      if ((pIVar9->IO).NavActive == false) {
        uVar12 = bVar24;
      }
      (pIVar9->IO).WantCaptureKeyboard = (bool)uVar12;
      (pIVar9->IO).WantTextInput = pIVar9->WantTextInputNextFrame - 1U < 0xfffffffe;
      return;
    }
    iVar16 = iVar15 + -1;
    ppIVar10 = ImVector<ImGuiWindow_*>::operator[](&pIVar9->Windows,iVar16);
    pIVar11 = *ppIVar10;
  } while (((pIVar11->Active != true) || (pIVar11->Hidden != false)) ||
          ((pIVar11->Flags & 0x200) != 0));
  IVar7 = (pIVar11->OuterRectClipped).Min;
  IVar8 = (pIVar11->OuterRectClipped).Max;
  bVar24 = (pIVar11->Flags & 0x1000042U) == 0;
  auVar26._1_3_ = 0;
  auVar26[0] = bVar24;
  auVar26[4] = bVar24;
  auVar26._5_3_ = 0;
  auVar26[8] = bVar24;
  auVar26._9_7_ = 0;
  auVar26 = auVar26 & local_78;
  auVar27._0_4_ = (auVar26._0_4_ << 0x1f) >> 0x1f;
  auVar27._4_4_ = (auVar26._4_4_ << 0x1f) >> 0x1f;
  auVar27._8_4_ = (auVar26._8_4_ << 0x1f) >> 0x1f;
  auVar27._12_4_ = (auVar26._12_4_ << 0x1f) >> 0x1f;
  auVar26 = ~auVar27 & local_58 | local_68 & auVar27;
  fVar25 = auVar26._0_4_;
  fVar28 = auVar26._4_4_;
  auVar5._4_8_ = SUB168(local_68 & auVar27,8);
  auVar5._0_4_ = fVar28;
  auVar29._0_8_ = auVar5._0_8_ << 0x20;
  auVar29._8_4_ = fVar25;
  auVar29._12_4_ = fVar28;
  local_88.Min.x = IVar7.x;
  local_88.Min.y = IVar7.y;
  local_88.Max.x = IVar8.x;
  local_88.Max.y = IVar8.y;
  auVar6._4_8_ = auVar29._8_8_;
  auVar6._0_4_ = fVar28 + local_88.Min.y;
  auVar30._0_8_ = auVar6._0_8_ << 0x20;
  auVar30._8_4_ = fVar25 + local_88.Max.x;
  auVar30._12_4_ = fVar28 + local_88.Max.y;
  local_88.Max = auVar30._8_8_;
  local_88.Min.y = local_88.Min.y - fVar28;
  local_88.Min.x = local_88.Min.x - fVar25;
  bVar24 = ImRect::Contains(&local_88,p);
  if (bVar24) {
    sVar3 = (pIVar11->HitTestHoleSize).x;
    if (sVar3 != 0) {
      auVar26 = pshuflw(ZEXT416((uint)pIVar11->HitTestHoleOffset),
                        ZEXT416((uint)pIVar11->HitTestHoleOffset),0x60);
      local_40.Min.x = (float)(auVar26._0_4_ >> 0x10) + (pIVar11->Pos).x;
      local_40.Min.y = (float)(auVar26._4_4_ >> 0x10) + (pIVar11->Pos).y;
      local_40.Max.x = (float)(int)sVar3 + local_40.Min.x;
      local_40.Max.y =
           (float)(int)((long)((ulong)(ushort)(pIVar11->HitTestHoleSize).y << 0x30) >> 0x30) +
           local_40.Min.y;
      bVar24 = ImRect::Contains(&local_40,p);
      if (bVar24) goto LAB_0013b02e;
    }
    if (pIVar23 == (ImGuiWindow *)0x0) {
      pIVar23 = pIVar11;
    }
    if (((local_98 == (ImGuiWindow *)0x0) &&
        (local_98 = pIVar11, pIVar9->MovingWindow != (ImGuiWindow *)0x0)) &&
       (pIVar11->RootWindow == pIVar9->MovingWindow->RootWindow)) {
      local_98 = (ImGuiWindow *)0x0;
    }
    else {
      if (pIVar23 != (ImGuiWindow *)0x0) goto LAB_0013b190;
      pIVar23 = (ImGuiWindow *)0x0;
    }
  }
  iVar16 = iVar15 + -1;
  goto LAB_0013b02e;
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;
    g.WindowsHoverPadding = ImMax(g.Style.TouchExtraPadding, ImVec2(WINDOWS_HOVER_PADDING, WINDOWS_HOVER_PADDING));

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    bool clear_hovered_windows = false;
    FindHoveredWindow();

    // Modal windows prevents mouse from hovering behind them.
    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window && g.HoveredWindow && !IsWindowChildOf(g.HoveredWindow->RootWindow, modal_window))
        clear_hovered_windows = true;

    // Disabled mouse?
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NoMouse)
        clear_hovered_windows = true;

    // We track click ownership. When clicked outside of a window the click is owned by the application and won't report hovering nor request capture even while dragging over our windows afterward.
    int mouse_earliest_button_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        if (g.IO.MouseClicked[i])
            g.IO.MouseDownOwned[i] = (g.HoveredWindow != NULL) || (g.OpenPopupStack.Size > 0);
        mouse_any_down |= g.IO.MouseDown[i];
        if (g.IO.MouseDown[i])
            if (mouse_earliest_button_down == -1 || g.IO.MouseClickedTime[i] < g.IO.MouseClickedTime[mouse_earliest_button_down])
                mouse_earliest_button_down = i;
    }
    const bool mouse_avail_to_imgui = (mouse_earliest_button_down == -1) || g.IO.MouseDownOwned[mouse_earliest_button_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail_to_imgui && !mouse_dragging_extern_payload)
        clear_hovered_windows = true;

    if (clear_hovered_windows)
        g.HoveredWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to imgui, false = dispatch mouse info to Dear ImGui + app)
    if (g.WantCaptureMouseNextFrame != -1)
        g.IO.WantCaptureMouse = (g.WantCaptureMouseNextFrame != 0);
    else
        g.IO.WantCaptureMouse = (mouse_avail_to_imgui && (g.HoveredWindow != NULL || mouse_any_down)) || (g.OpenPopupStack.Size > 0);

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to imgui, false = dispatch keyboard info to Dear ImGui + app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        g.IO.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        g.IO.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (g.IO.NavActive && (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        g.IO.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    g.IO.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}